

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_extend(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQArray *in_RDI;
  SQArray *unaff_retaddr;
  SQInteger in_stack_ffffffffffffffe8;
  HSQUIRRELVM in_stack_fffffffffffffff0;
  HSQUIRRELVM v_00;
  
  pSVar1 = stack_get(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  v_00 = (HSQUIRRELVM)(pSVar1->super_SQObject)._unVal.pTable;
  stack_get(v_00,in_stack_ffffffffffffffe8);
  SQArray::Extend(unaff_retaddr,in_RDI);
  sq_pop(v_00,in_stack_ffffffffffffffe8);
  return 1;
}

Assistant:

static SQInteger array_extend(HSQUIRRELVM v)
{
    _array(stack_get(v,1))->Extend(_array(stack_get(v,2)));
    sq_pop(v,1);
    return 1;
}